

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

Box3f * anon_unknown.dwarf_355c8::transformSimple(Box3f *b,M44f *M)

{
  float *pfVar1;
  Vec3<float> *in_RSI;
  Box3f *in_RDI;
  int j;
  V3f p;
  int i;
  Box3f *b1;
  Vec3<float> *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  Vec3<float> *in_stack_ffffffffffffffc8;
  int local_2c;
  Vec3<float> local_28;
  int local_1c;
  Vec3<float> *local_10;
  
  local_10 = in_RSI;
  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::Box
            ((Box<Imath_3_2::Vec3<float>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    Imath_3_2::Vec3<float>::Vec3(&local_28);
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      if ((local_1c >> ((byte)local_2c & 0x1f) & 1U) == 0) {
        pfVar1 = Imath_3_2::Vec3<float>::operator[](local_10,local_2c);
        in_stack_ffffffffffffffb0 = *pfVar1;
      }
      else {
        pfVar1 = Imath_3_2::Vec3<float>::operator[](local_10 + 1,local_2c);
        in_stack_ffffffffffffffb0 = *pfVar1;
      }
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0;
      pfVar1 = Imath_3_2::Vec3<float>::operator[](&local_28,local_2c);
      *pfVar1 = in_stack_ffffffffffffffb0;
    }
    Imath_3_2::operator*(in_stack_ffffffffffffffc8,(Matrix44<float> *)in_RDI);
    Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
              ((Box<Imath_3_2::Vec3<float>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

Box3f
transformSimple (const Box3f& b, const M44f& M)
{
    Box3f b1;

    for (int i = 0; i < 8; ++i)
    {
        V3f p;

        for (int j = 0; j < 3; ++j)
            p[j] = ((i >> j) & 1) ? b.max[j] : b.min[j];

        b1.extendBy (p * M);
    }

    return b1;
}